

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIOctreeTracer.cpp
# Opt level: O1

void UI::OctreeTracerMenuItems(shared_ptr<OctreeTracer> *octree_tracer)

{
  bool bVar1;
  
  bVar1 = ImGui::BeginMenu("View",true);
  if (bVar1) {
    bVar1 = ImGui::MenuItem("Diffuse",(char *)0x0,
                            ((octree_tracer->
                             super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                            m_view_type == kDiffuse,true);
    if (bVar1) {
      ((octree_tracer->super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      m_view_type = kDiffuse;
    }
    bVar1 = ImGui::MenuItem("Normal",(char *)0x0,
                            ((octree_tracer->
                             super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                            m_view_type == kNormal,true);
    if (bVar1) {
      ((octree_tracer->super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      m_view_type = kNormal;
    }
    bVar1 = ImGui::MenuItem("Position",(char *)0x0,
                            ((octree_tracer->
                             super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                            m_view_type == kPosition,true);
    if (bVar1) {
      ((octree_tracer->super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      m_view_type = kPosition;
    }
    bVar1 = ImGui::MenuItem("Iterations",(char *)0x0,
                            ((octree_tracer->
                             super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                            m_view_type == kIteration,true);
    if (bVar1) {
      ((octree_tracer->super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      m_view_type = kIteration;
    }
    ImGui::Separator();
    ImGui::Checkbox("Beam Optimization",
                    &((octree_tracer->super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->m_beam_enable);
    ImGui::EndMenu();
    return;
  }
  return;
}

Assistant:

void OctreeTracerMenuItems(const std::shared_ptr<OctreeTracer> &octree_tracer) {
	if (ImGui::BeginMenu("View")) {
		if (ImGui::MenuItem("Diffuse", nullptr, octree_tracer->m_view_type == OctreeTracer::ViewTypes::kDiffuse))
			octree_tracer->m_view_type = OctreeTracer::ViewTypes::kDiffuse;
		if (ImGui::MenuItem("Normal", nullptr, octree_tracer->m_view_type == OctreeTracer::ViewTypes::kNormal))
			octree_tracer->m_view_type = OctreeTracer::ViewTypes::kNormal;
		if (ImGui::MenuItem("Position", nullptr, octree_tracer->m_view_type == OctreeTracer::ViewTypes::kPosition))
			octree_tracer->m_view_type = OctreeTracer::ViewTypes::kPosition;
		if (ImGui::MenuItem("Iterations", nullptr, octree_tracer->m_view_type == OctreeTracer::ViewTypes::kIteration))
			octree_tracer->m_view_type = OctreeTracer::ViewTypes::kIteration;

		ImGui::Separator();

		ImGui::Checkbox("Beam Optimization", &octree_tracer->m_beam_enable);
		ImGui::EndMenu();
	}
}